

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O2

void __thiscall
discordpp::
field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
::field(field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
        *this,field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
              *f)

{
  if ((f->t_)._M_t.
      super___uniq_ptr_impl<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>,_std::default_delete<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_*,_std::default_delete<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>_>
      .
      super__Head_base<0UL,_std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_*,_false>
      ._M_head_impl ==
      (vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>
       *)0x0) {
    (this->t_)._M_t.
    super___uniq_ptr_impl<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>,_std::default_delete<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_*,_std::default_delete<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>_>
    .
    super__Head_base<0UL,_std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_*,_false>
    ._M_head_impl =
         (vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>
          *)0x0;
  }
  else {
    std::
    make_unique<std::vector<discordpp::ApplicationCommandOptionChoice,std::allocator<discordpp::ApplicationCommandOptionChoice>>,std::vector<discordpp::ApplicationCommandOptionChoice,std::allocator<discordpp::ApplicationCommandOptionChoice>>&>
              ((vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>
                *)this);
  }
  this->s_ = f->s_;
  return;
}

Assistant:

field(const field<T> &f)
        : t_(f.t_ ? std::make_unique<T>(*f.t_) : nullptr), s_(f.s_) {}